

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pFan1_1;
  Gia_Obj_t *pFan0_1;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManAppendObj(p);
  if (-1 < iLit0) {
    iVar1 = Abc_Lit2Var(iLit0);
    iVar2 = Gia_ManObjNum(p);
    if (iVar1 < iVar2) {
      if (-1 < iLit1) {
        iVar1 = Abc_Lit2Var(iLit1);
        iVar2 = Gia_ManObjNum(p);
        if (iVar1 < iVar2) {
          if (p->fGiaSimple == 0) {
            iVar1 = Abc_Lit2Var(iLit0);
            iVar2 = Abc_Lit2Var(iLit1);
            if (iVar1 == iVar2) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
          }
          if (iLit0 < iLit1) {
            iVar1 = Gia_ObjId(p,pObj_00);
            iVar2 = Abc_Lit2Var(iLit0);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0xffffffffe0000000 | (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
            uVar3 = Abc_LitIsCompl(iLit0);
            *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
            iVar1 = Gia_ObjId(p,pObj_00);
            iVar2 = Abc_Lit2Var(iLit1);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0xe0000000ffffffff |
                 ((ulong)(uint)(iVar1 - iVar2) & 0x1fffffff) << 0x20;
            uVar3 = Abc_LitIsCompl(iLit1);
            *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
          }
          else {
            iVar1 = Gia_ObjId(p,pObj_00);
            iVar2 = Abc_Lit2Var(iLit0);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0xe0000000ffffffff |
                 ((ulong)(uint)(iVar1 - iVar2) & 0x1fffffff) << 0x20;
            uVar3 = Abc_LitIsCompl(iLit0);
            *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
            iVar1 = Gia_ObjId(p,pObj_00);
            iVar2 = Abc_Lit2Var(iLit1);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0xffffffffe0000000 | (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
            uVar3 = Abc_LitIsCompl(iLit1);
            *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
          }
          if (p->pFanData != (int *)0x0) {
            pGVar7 = Gia_ObjFanin0(pObj_00);
            Gia_ObjAddFanout(p,pGVar7,pObj_00);
            pGVar7 = Gia_ObjFanin1(pObj_00);
            Gia_ObjAddFanout(p,pGVar7,pObj_00);
          }
          if (p->fSweeper != 0) {
            pGVar7 = Gia_ObjFanin0(pObj_00);
            pGVar8 = Gia_ObjFanin1(pObj_00);
            if ((*(ulong *)pGVar7 >> 0x1e & 1) == 0) {
              *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff | 0x40000000;
            }
            else {
              *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
            }
            if ((*(ulong *)pGVar8 >> 0x1e & 1) == 0) {
              *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffbfffffff | 0x40000000;
            }
            else {
              *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xbfffffffffffffff | 0x4000000000000000;
            }
            uVar3 = Gia_ObjPhase(pGVar7);
            uVar4 = Gia_ObjFaninC0(pObj_00);
            uVar5 = Gia_ObjPhase(pGVar8);
            uVar6 = Gia_ObjFaninC1(pObj_00);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0x7fffffffffffffff |
                 (ulong)((uVar3 ^ uVar4) & (uVar5 ^ uVar6)) << 0x3f;
          }
          if (p->fBuiltInSim != 0) {
            pGVar7 = Gia_ObjFanin0(pObj_00);
            pGVar8 = Gia_ObjFanin1(pObj_00);
            uVar3 = Gia_ObjPhase(pGVar7);
            uVar4 = Gia_ObjFaninC0(pObj_00);
            uVar5 = Gia_ObjPhase(pGVar8);
            uVar6 = Gia_ObjFaninC1(pObj_00);
            *(ulong *)pObj_00 =
                 *(ulong *)pObj_00 & 0x7fffffffffffffff |
                 (ulong)((uVar3 ^ uVar4) & (uVar5 ^ uVar6)) << 0x3f;
            iVar1 = Gia_ObjId(p,pObj_00);
            Gia_ManBuiltInSimPerform(p,iVar1);
          }
          if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
            Gia_ManQuantSetSuppAnd(p,pObj_00);
          }
          iVar1 = Gia_ObjId(p,pObj_00);
          return iVar1 << 1;
        }
      }
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
}

Assistant:

static inline int Gia_ManAppendAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    if ( iLit0 < iLit1 )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    if ( p->pFanData )
    {
        Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
    if ( p->fSweeper )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        if ( pFan0->fMark0 ) pFan0->fMark1 = 1; else pFan0->fMark0 = 1;
        if ( pFan1->fMark0 ) pFan1->fMark1 = 1; else pFan1->fMark0 = 1;
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
    }
    if ( p->fBuiltInSim )
    {
        Gia_Obj_t * pFan0 = Gia_ObjFanin0(pObj);
        Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
        pObj->fPhase = (Gia_ObjPhase(pFan0) ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjPhase(pFan1) ^ Gia_ObjFaninC1(pObj));
        Gia_ManBuiltInSimPerform( p, Gia_ObjId( p, pObj ) );
    }
    if ( p->vSuppWords )
        Gia_ManQuantSetSuppAnd( p, pObj );
    return Gia_ObjId( p, pObj ) << 1;
}